

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O0

void run_named_test(TestSuite *suite,char *name,TestReporter *reporter)

{
  _Bool _Var1;
  uint32_t uVar2;
  int iVar3;
  uint32_t uVar4;
  int iVar5;
  uint32_t end_time_in_milliseconds;
  TestReporter *in_RDX;
  TestSuite *in_RSI;
  undefined8 *in_RDI;
  uint32_t test_starting_milliseconds;
  uint32_t total_test_starting_milliseconds;
  int i;
  TestSuite *suite_00;
  TestSuite *suite_01;
  TestReporter *name_00;
  
  uVar2 = cgreen_time_get_current_milliseconds();
  suite_01 = (TestSuite *)in_RDX->start_suite;
  suite_00 = (TestSuite *)*in_RDI;
  name_00 = in_RDX;
  iVar3 = count_tests((TestSuite *)in_RDX);
  (*(code *)suite_01)(in_RDX,suite_00,iVar3);
  for (iVar3 = 0; iVar3 < *(int *)(in_RDI + 6); iVar3 = iVar3 + 1) {
    if ((*(int *)(in_RDI[3] + (long)iVar3 * 0x18) != 0) &&
       (_Var1 = has_test(suite_00,(char *)in_RDX), _Var1)) {
      (*(code *)in_RDI[4])();
      run_named_test(in_RSI,(char *)name_00,(TestReporter *)CONCAT44(iVar3,uVar2));
      (*(code *)in_RDI[5])();
    }
  }
  name_00->passes = 0;
  name_00->failures = 0;
  name_00->skips = 0;
  name_00->exceptions = 0;
  uVar4 = cgreen_time_get_current_milliseconds();
  for (iVar3 = 0; iVar3 < *(int *)(in_RDI + 6); iVar3 = iVar3 + 1) {
    if ((*(int *)(in_RDI[3] + (long)iVar3 * 0x18) == 0) &&
       (iVar5 = strcmp(*(char **)(in_RDI[3] + (long)iVar3 * 0x18 + 8),(char *)in_RSI), iVar5 == 0))
    {
      run_test_in_the_current_process(suite_01,(CgreenTest *)suite_00,in_RDX);
    }
  }
  end_time_in_milliseconds = cgreen_time_get_current_milliseconds();
  uVar4 = cgreen_time_duration_in_milliseconds(uVar4,end_time_in_milliseconds);
  name_00->duration = uVar4;
  uVar4 = cgreen_time_get_current_milliseconds();
  uVar2 = cgreen_time_duration_in_milliseconds(uVar2,uVar4);
  name_00->total_duration = uVar2;
  send_reporter_completion_notification((TestReporter *)0x10fd3e);
  (*name_00->finish_suite)(name_00,(char *)in_RDI[1],*(int *)(in_RDI + 2));
  return;
}

Assistant:

static void run_named_test(TestSuite *suite, const char *name, TestReporter *reporter)
{
    int i;

    uint32_t total_test_starting_milliseconds = cgreen_time_get_current_milliseconds();

    (*reporter->start_suite)(reporter, suite->name, count_tests(suite));
    for (i = 0; i < suite->size; i++)
    {
        if (suite->tests[i].type != test_function &&
            has_test(suite->tests[i].Runnable.suite, name))
        {
            (*suite->setup)();
            run_named_test(suite->tests[i].Runnable.suite, name, reporter);
            (*suite->teardown)();
        }
    }

    // Reset counters for top-level tests
    reporter->passes = 0;
    reporter->failures = 0;
    reporter->skips = 0;
    reporter->exceptions = 0;

    uint32_t test_starting_milliseconds = cgreen_time_get_current_milliseconds();

    for (i = 0; i < suite->size; i++)
    {
        if (suite->tests[i].type == test_function)
        {
            if (strcmp(suite->tests[i].name, name) == 0)
            {
                run_test_in_the_current_process(suite, suite->tests[i].Runnable.test, reporter);
            }
        }
    }

    reporter->duration = cgreen_time_duration_in_milliseconds(test_starting_milliseconds,
                                                              cgreen_time_get_current_milliseconds());
    reporter->total_duration = cgreen_time_duration_in_milliseconds(total_test_starting_milliseconds,
                                                                    cgreen_time_get_current_milliseconds());

    send_reporter_completion_notification(reporter);
    (*reporter->finish_suite)(reporter, suite->filename, suite->line);
}